

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O1

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<glm::vec<3,float,(glm::qualifier)0>,3u,std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>,void>
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,polyscope *this)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  size_t j;
  long lVar4;
  pointer pvVar5;
  size_type __n;
  allocator_type local_29;
  
  lVar2 = *(long *)(this + 8);
  lVar3 = *(long *)this;
  __n = (lVar2 - lVar3 >> 3) * -0x5555555555555555;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,__n,&local_29);
  if (lVar2 != lVar3) {
    lVar2 = *(long *)this;
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        pvVar5 = (pointer)&pvVar1[lVar3].field_2;
        if (((int)lVar4 != 2) && (pvVar5 = pvVar1 + lVar3, (int)lVar4 == 1)) {
          pvVar5 = (pointer)&pvVar1[lVar3].field_1;
        }
        (pvVar5->field_0).x = (float)*(double *)(lVar2 + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 != __n + (__n == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<6>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}